

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.cc
# Opt level: O3

void __thiscall
fasttext::Loss::findKBest(Loss *this,int32_t k,real threshold,Predictions *heap,Vector *output)

{
  pointer pfVar1;
  __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  _Var2;
  pair<float,_int> __value;
  pointer pfVar3;
  pointer ppVar4;
  ulong uVar5;
  double dVar6;
  uint local_40;
  float local_3c;
  _Iter_comp_val<bool_(*)(const_std::pair<float,_int>_&,_const_std::pair<float,_int>_&)> local_38;
  
  local_40 = 0;
  pfVar3 = (output->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  pfVar1 = (output->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pfVar1 != pfVar3 && -1 < (long)pfVar1 - (long)pfVar3) {
    uVar5 = 0;
    local_3c = threshold;
    do {
      if (local_3c <= pfVar3[uVar5]) {
        if ((long)(heap->
                  super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(heap->
                  super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 3 == (long)k) {
          dVar6 = ::log((double)pfVar3[uVar5] + 1e-05);
          if ((float)dVar6 <
              ((heap->
               super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
               _M_impl.super__Vector_impl_data._M_start)->first) goto LAB_00129945;
          uVar5 = (ulong)local_40;
          pfVar3 = (output->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
        }
        dVar6 = ::log((double)pfVar3[(int)uVar5] + 1e-05);
        local_38._M_comp._0_4_ = (float)dVar6;
        std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>::
        emplace_back<float,int&>
                  ((vector<std::pair<float,int>,std::allocator<std::pair<float,int>>> *)heap,
                   (float *)&local_38,(int *)&local_40);
        ppVar4 = (heap->
                 super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>)
                 ._M_impl.super__Vector_impl_data._M_finish;
        _Var2._M_current =
             (heap->
             super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
        local_38._M_comp = comparePairs;
        std::
        __push_heap<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,long,std::pair<float,int>,__gnu_cxx::__ops::_Iter_comp_val<bool(*)(std::pair<float,int>const&,std::pair<float,int>const&)>>
                  (_Var2,((long)ppVar4 - (long)_Var2._M_current >> 3) + -1,0,ppVar4[-1],&local_38);
        ppVar4 = (heap->
                 super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>)
                 ._M_impl.super__Vector_impl_data._M_finish;
        _Var2._M_current =
             (heap->
             super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
        if ((ulong)(long)k < (ulong)((long)ppVar4 - (long)_Var2._M_current >> 3)) {
          if (8 < (long)ppVar4 - (long)_Var2._M_current) {
            __value = ppVar4[-1];
            ppVar4[-1].first = (_Var2._M_current)->first;
            ppVar4[-1].second = (_Var2._M_current)->second;
            std::
            __adjust_heap<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,long,std::pair<float,int>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<float,int>const&,std::pair<float,int>const&)>>
                      (_Var2,0,(long)ppVar4 + (-8 - (long)_Var2._M_current) >> 3,__value,
                       (_Iter_comp_iter<bool_(*)(const_std::pair<float,_int>_&,_const_std::pair<float,_int>_&)>
                        )comparePairs);
            ppVar4 = (heap->
                     super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          }
          (heap->super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>)
          ._M_impl.super__Vector_impl_data._M_finish = ppVar4 + -1;
        }
      }
LAB_00129945:
      uVar5 = (long)(int)local_40 + 1;
      local_40 = (uint)uVar5;
      pfVar3 = (output->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while ((long)uVar5 <
             (long)(output->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pfVar3 >> 2);
  }
  return;
}

Assistant:

void Loss::findKBest(
    int32_t k,
    real threshold,
    Predictions& heap,
    const Vector& output) const {
  for (int32_t i = 0; i < output.size(); i++) {
    if (output[i] < threshold) {
      continue;
    }
    if (heap.size() == k && std_log(output[i]) < heap.front().first) {
      continue;
    }
    heap.emplace_back(std_log(output[i]), i);
    std::push_heap(heap.begin(), heap.end(), comparePairs);
    if (heap.size() > k) {
      std::pop_heap(heap.begin(), heap.end(), comparePairs);
      heap.pop_back();
    }
  }
}